

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UBool icu_63::ICU_Utility::escapeUnprintable(UnicodeString *result,UChar32 c)

{
  UBool UVar1;
  char16_t srcChar;
  
  if (c - 0x20U < 0x5f) {
    UVar1 = '\0';
  }
  else {
    UnicodeString::append(result,L'\\');
    srcChar = L'u';
    if (0xffff < (uint)c) {
      UnicodeString::append(result,L'U');
      UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(uint)c >> 0x1c]);
      UnicodeString::append
                (result,*(char16_t *)
                         ((long)L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" +
                         (ulong)((uint)c >> 0x17 & 0x1e)));
      UnicodeString::append
                (result,*(char16_t *)
                         ((long)L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" +
                         (ulong)((uint)c >> 0x13 & 0x1e)));
      srcChar = *(char16_t *)
                 ((long)L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + (ulong)((uint)c >> 0xf & 0x1e));
    }
    UnicodeString::append(result,srcChar);
    UnicodeString::append
              (result,*(char16_t *)
                       ((long)L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" +
                       (ulong)((uint)c >> 0xb & 0x1e)));
    UnicodeString::append
              (result,*(char16_t *)
                       ((long)L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + (ulong)((uint)c >> 7 & 0x1e)
                       ));
    UnicodeString::append
              (result,*(char16_t *)
                       ((long)L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + (ulong)((uint)c >> 3 & 0x1e)
                       ));
    UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[c & 0xf]);
    UVar1 = '\x01';
  }
  return UVar1;
}

Assistant:

UBool ICU_Utility::escapeUnprintable(UnicodeString& result, UChar32 c) {
    if (isUnprintable(c)) {
        result.append(BACKSLASH);
        if (c & ~0xFFFF) {
            result.append(UPPER_U);
            result.append(DIGITS[0xF&(c>>28)]);
            result.append(DIGITS[0xF&(c>>24)]);
            result.append(DIGITS[0xF&(c>>20)]);
            result.append(DIGITS[0xF&(c>>16)]);
        } else {
            result.append(LOWER_U);
        }
        result.append(DIGITS[0xF&(c>>12)]);
        result.append(DIGITS[0xF&(c>>8)]);
        result.append(DIGITS[0xF&(c>>4)]);
        result.append(DIGITS[0xF&c]);
        return TRUE;
    }
    return FALSE;
}